

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explicit.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Circle d;
  Circle a;
  Circle f;
  Circle e;
  Circle c;
  Circle b;
  Circle CStack_68;
  Circle local_58;
  Circle local_48;
  Circle local_38;
  Circle local_28;
  Circle local_18;
  
  Circle::Circle(&local_58,1.23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======================",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Circle::Circle(&local_18,0x7b,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======================",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Circle::Circle(&local_28,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======================",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Circle::Circle(&CStack_68,1.23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======================",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Circle::Circle(&local_38,0x7b,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======================",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Circle::Circle(&local_48,&CStack_68);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=======================",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  Circle::~Circle(&local_48);
  Circle::~Circle(&local_38);
  Circle::~Circle(&CStack_68);
  Circle::~Circle(&local_28);
  Circle::~Circle(&local_18);
  Circle::~Circle(&local_58);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	Circle a = 1.23;

	cout << "=======================" << endl;

	Circle b = 123;

	cout << "=======================" << endl;

	Circle c = a;

	cout << "=======================" << endl;

	Circle d = Circle(1.23);

	cout << "=======================" << endl;

	Circle e = Circle(123);

	cout << "=======================" << endl;

	Circle f = d;

	cout << "=======================" << endl;
}